

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O0

void __thiscall
supermap::BloomFilter<supermap::Key<1UL>_>::BloomFilter
          (BloomFilter<supermap::Key<1UL>_> *this,double errorProbability,
          unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *hasher)

{
  bool bVar1;
  IllegalArgumentException *this_00;
  double *__new_size;
  unsigned_long *puVar2;
  reference puVar3;
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  __type_conflict __x;
  double dVar4;
  unsigned_long *seed;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  mt19937_64 rnd;
  unsigned_long numberOfHashFunctions;
  size_t keysSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffe1b8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffe1c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffe1e0;
  allocator<char> *__a;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1de0;
  undefined8 *local_1dd8;
  ulong local_80;
  unsigned_long local_78;
  unsigned_long local_70;
  undefined8 local_68;
  double local_60;
  double local_58;
  undefined1 local_4d;
  string local_38 [40];
  double local_10;
  
  local_10 = in_XMM0_Qa;
  Filter<supermap::Key<1UL>_>::Filter((Filter<supermap::Key<1UL>_> *)in_stack_ffffffffffffe1c0);
  *in_RDI = &PTR_clone_0016d988;
  __a = (allocator<char> *)(in_RDI + 1);
  std::unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_>::unique_ptr
            ((unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)
             in_stack_ffffffffffffe1c0,
             (unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)
             in_stack_ffffffffffffe1b8);
  __s = (char *)(in_RDI + 3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1172ee);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 6);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x117301);
  *(undefined1 *)(in_RDI + 0xb) = 0;
  if ((0.0 < local_10) && (local_10 <= 1.0)) {
    local_58 = 1.0;
    local_60 = log2(local_10);
    local_60 = local_60 * -1.44;
    __new_size = std::max<double>(&local_58,&local_60);
    in_RDI[2] = *__new_size;
    local_68 = 1;
    local_78 = 1;
    __x = std::log2<unsigned_long>(0x117495);
    dVar4 = ceil(__x);
    local_80 = (long)dVar4 | (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f;
    puVar2 = std::max<unsigned_long>(&local_78,&local_80);
    local_70 = *puVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_stack_ffffffffffffe1e0,(size_type)__new_size);
    std::random_device::random_device((random_device *)this_01);
    std::random_device::operator()((random_device *)0x117524);
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::mersenne_twister_engine(in_stack_ffffffffffffe1c0,(result_type)in_stack_ffffffffffffe1b8);
    std::random_device::~random_device((random_device *)0x11754b);
    local_1dd8 = in_RDI + 3;
    local_1de0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_ffffffffffffe1b8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffe1b8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffe1c0,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffe1b8);
      if (!bVar1) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_1de0);
      in_stack_ffffffffffffe1c0 =
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()(in_stack_ffffffffffffe1c0);
      *puVar3 = (unsigned_long)in_stack_ffffffffffffe1c0;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_1de0);
    }
    return;
  }
  local_4d = 1;
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  supermap::IllegalArgumentException::IllegalArgumentException(this_00,local_38);
  local_4d = 0;
  __cxa_throw(this_00,&IllegalArgumentException::typeinfo,
              IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

explicit BloomFilter(double errorProbability, std::unique_ptr<Hasher> &&hasher) : hasher_(std::move(hasher)) {
        if (errorProbability <= 0 || errorProbability > 1) {
            throw supermap::IllegalArgumentException("Error probability must be a positive number not bigger than 1");
        }
        sizeMultiplier_ = std::max(1.0, -1.44 * std::log2(errorProbability));
        constexpr std::size_t keysSize = io::FixedDeserializedSizeRegister<T>::exactDeserializedSize;
        auto numberOfHashFunctions = std::max(1ul, static_cast<std::size_t>(std::ceil(std::log2(keysSize))));
        seeds_.resize(numberOfHashFunctions);
        std::mt19937_64 rnd(std::random_device{}());
        for (auto &seed : seeds_) {
            seed = rnd();
        }
    }